

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_set_layouts
          (Impl *this,Value *layouts,VkDescriptorSetLayout **out_layout)

{
  SizeType SVar1;
  VkDescriptorSetLayout_T **ppVVar2;
  ValueIterator this_00;
  ValueIterator pGVar3;
  Ch *str;
  iterator iVar4;
  uint64_t index;
  Hash local_48;
  VkDescriptorSetLayout_T **local_40;
  VkDescriptorSetLayout **local_38;
  
  local_38 = out_layout;
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(layouts);
  ppVVar2 = ScratchAllocator::allocate_n_cleared<VkDescriptorSetLayout_T*>
                      (&this->allocator,(ulong)SVar1);
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Begin(layouts);
  local_40 = ppVVar2;
  do {
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(layouts);
    if (this_00 == pGVar3) {
      *local_38 = local_40;
LAB_00114518:
      return this_00 == pGVar3;
    }
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(this_00);
    local_48 = string_to_uint64(str);
    if (local_48 != 0) {
      iVar4 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->replayed_descriptor_set_layouts)._M_h,&local_48);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        log_missing_resource("Descriptor set layout",local_48);
        goto LAB_00114518;
      }
      if (*(VkDescriptorSetLayout_T **)
           ((long)iVar4.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>
                  ._M_cur + 0x10) == (VkDescriptorSetLayout_T *)0x0) {
        log_invalid_resource("Descriptor set layout",local_48);
        goto LAB_00114518;
      }
      *ppVVar2 = *(VkDescriptorSetLayout_T **)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_false>
                         ._M_cur + 0x10);
    }
    this_00 = this_00 + 1;
    ppVVar2 = ppVVar2 + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_set_layouts(const Value &layouts, const VkDescriptorSetLayout **out_layout)
{
	auto *infos = allocator.allocate_n_cleared<VkDescriptorSetLayout>(layouts.Size());
	auto *ret = infos;

	for (auto itr = layouts.Begin(); itr != layouts.End(); ++itr, infos++)
	{
		auto index = string_to_uint64(itr->GetString());
		if (index > 0)
		{
			auto set_itr = replayed_descriptor_set_layouts.find(index);
			if (set_itr == end(replayed_descriptor_set_layouts))
			{
				log_missing_resource("Descriptor set layout", index);
				return false;
			}
			else if (set_itr->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Descriptor set layout", index);
				return false;
			}
			else
				*infos = set_itr->second;
		}
	}

	*out_layout = ret;
	return true;
}